

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_landscape.h
# Opt level: O0

void __thiscall
Gudhi::Persistence_representations::Persistence_landscape::
construct_persistence_landscape_from_barcode
          (Persistence_landscape *this,
          vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *p,
          size_t number_of_levels)

{
  double dVar1;
  double dVar2;
  pair<double,_double> a;
  pair<double,_double> a_00;
  pair<double,_double> a_01;
  pair<double,_double> a_02;
  pair<double,_double> a_03;
  pair<double,_double> a_04;
  pair<double,_double> a_05;
  pair<double,_double> a_06;
  pair<double,_double> a_07;
  pair<double,_double> a_08;
  pair<double,_double> a_09;
  pair<double,_double> a_10;
  pair<double,_double> a_11;
  pair<double,_double> a_12;
  pair<double,_double> a_13;
  pair<double,_double> a_14;
  pair<double,_double> a_15;
  pair<double,_double> a_16;
  pair<double,_double> a_17;
  pair<double,_double> a_18;
  pair<double,_double> a_19;
  pair<double,_double> a_20;
  pair<double,_double> a_21;
  pair<double,_double> a_22;
  pair<double,_double> a_23;
  pair<double,_double> a_24;
  pair<double,_double> a_25;
  pair<double,_double> a_26;
  double *pdVar3;
  pointer ppVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  const_iterator __first;
  const_iterator __last;
  iterator __first_00;
  iterator __last_00;
  pointer ppVar8;
  reference pvVar9;
  ostream *poVar10;
  size_type sVar11;
  size_type sVar12;
  ostream *this_00;
  Persistence_representations *pPVar13;
  Persistence_representations *this_01;
  Persistence_representations *pPVar14;
  pair<double,_double> pVar15;
  pair<double,_int> pVar16;
  int local_4dc;
  __normal_iterator<std::pair<double,_double>_*,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
  local_4d0;
  const_iterator local_4c8;
  pair<double,_double> *local_4c0;
  __normal_iterator<std::pair<double,_double>_*,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
  local_4b8;
  __normal_iterator<std::pair<double,_double>_*,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
  local_4b0;
  const_iterator local_4a8;
  int local_4a0;
  int local_49c;
  pair<int,_int> local_498;
  pair<double,_double> local_490;
  double local_480;
  int local_478;
  int local_46c;
  double local_468;
  double dStack_460;
  double local_450;
  pair<double,_int> local_448;
  pair<double,_double> local_438;
  double local_428;
  double dStack_420;
  double local_418;
  double dStack_410;
  double local_400;
  int local_3f8;
  int local_3ec;
  double local_3e8;
  double dStack_3e0;
  double local_3d8;
  pair<double,_int> local_3d0;
  pair<double,_double> local_3c0;
  double local_3b0;
  int local_3a8;
  int local_39c;
  double local_398;
  double dStack_390;
  double local_380;
  pair<double,_int> local_378;
  pair<double,_double> local_368;
  double local_358;
  double dStack_350;
  double local_348;
  double dStack_340;
  double local_338;
  double dStack_330;
  double local_328;
  double dStack_320;
  double local_318;
  double local_310;
  double local_308;
  double local_300;
  double local_2f8;
  double local_2f0;
  double local_2e8;
  double local_2e0;
  double local_2d8;
  double local_2d0;
  double local_2c8;
  double local_2c0;
  double local_2b8;
  double dStack_2b0;
  double local_2a8;
  double dStack_2a0;
  double local_298;
  double dStack_290;
  double local_288;
  double dStack_280;
  double local_270;
  double local_268;
  double dStack_260;
  double local_258;
  double dStack_250;
  double local_248;
  undefined1 auStack_240 [8];
  pair<double,_double> point;
  long local_1d0;
  size_t p_1;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
  newCharacteristicPoints;
  size_t i_2;
  int local_17c;
  double local_178;
  double dStack_170;
  double local_160;
  pair<double,_int> local_158;
  pair<double,_double> local_148;
  int local_138;
  int local_134;
  pair<int,_int> local_130;
  pair<double,_double> local_128;
  undefined1 local_118 [8];
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> lambda_n;
  size_t i_3;
  size_t number_of_levels_in_the_landscape;
  vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  Persistence_landscape;
  double local_d0;
  pair<double,_double> local_c8;
  size_type local_b8;
  size_t i_1;
  undefined1 local_a8 [8];
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
  characteristicPoints;
  size_t i;
  __normal_iterator<std::pair<double,_double>_*,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
  local_50;
  const_iterator local_48;
  undefined1 local_40 [8];
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> bars;
  bool dbg;
  size_t number_of_levels_local;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *p_local;
  Persistence_landscape *this_local;
  
  bars.super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::vector
            ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
             local_40);
  local_50._M_current =
       (pair<double,_double> *)
       std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::begin
                 ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
                  local_40);
  __gnu_cxx::
  __normal_iterator<std::pair<double,double>const*,std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>>
  ::__normal_iterator<std::pair<double,double>*>
            ((__normal_iterator<std::pair<double,double>const*,std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>>
              *)&local_48,&local_50);
  __first = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
            begin(p);
  __last = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::end
                     (p);
  std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
  insert<__gnu_cxx::__normal_iterator<std::pair<double,double>const*,std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>>,void>
            ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)local_40,
             local_48,(__normal_iterator<const_std::pair<double,_double>_*,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
                       )__first._M_current,
             (__normal_iterator<const_std::pair<double,_double>_*,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
              )__last._M_current);
  __first_00 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               begin((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      *)local_40);
  __last_00 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
              end((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
                  local_40);
  std::
  sort<__gnu_cxx::__normal_iterator<std::pair<double,double>*,std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>>,bool(*)(std::pair<double,double>,std::pair<double,double>)>
            ((__normal_iterator<std::pair<double,_double>_*,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
              )__first_00._M_current,
             (__normal_iterator<std::pair<double,_double>_*,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
              )__last_00._M_current,compare_points_sorting);
  if ((bars.
       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
    std::operator<<((ostream *)&std::clog,"Bars : \n");
    for (characteristicPoints.
         super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ppVar4 = characteristicPoints.
                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
        ppVar8 = (pointer)std::
                          vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ::size((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                  *)local_40), ppVar4 != ppVar8;
        characteristicPoints.
        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)((long)&(characteristicPoints.
                               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage)->first + 1)) {
      pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                           *)local_40,
                          (size_type)
                          characteristicPoints.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      poVar10 = (ostream *)std::ostream::operator<<(&std::clog,pvVar9->first);
      poVar10 = std::operator<<(poVar10," ");
      pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                           *)local_40,
                          (size_type)
                          characteristicPoints.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,pvVar9->second);
      std::operator<<(poVar10,"\n");
    }
    getchar();
  }
  sVar11 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::size
                     (p);
  std::allocator<std::pair<double,_double>_>::allocator
            ((allocator<std::pair<double,_double>_> *)((long)&i_1 + 7));
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::vector
            ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
             local_a8,sVar11,(allocator<std::pair<double,_double>_> *)((long)&i_1 + 7));
  std::allocator<std::pair<double,_double>_>::~allocator
            ((allocator<std::pair<double,_double>_> *)((long)&i_1 + 7));
  for (local_b8 = 0; sVar11 = local_b8,
      sVar12 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               size((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     *)local_40), sVar11 != sVar12; local_b8 = local_b8 + 1) {
    pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
             operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         *)local_40,local_b8);
    dVar1 = pvVar9->first;
    pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
             operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         *)local_40,local_b8);
    local_d0 = (dVar1 + pvVar9->second) * 0.5;
    pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
             operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         *)local_40,local_b8);
    dVar1 = pvVar9->second;
    pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
             operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         *)local_40,local_b8);
    Persistence_landscape.
    super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)((dVar1 - pvVar9->first) * 0.5);
    pVar15 = std::make_pair<double,double>
                       (&local_d0,
                        (double *)
                        &Persistence_landscape.
                         super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_c8.second = pVar15.second;
    local_c8.first = pVar15.first;
    pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
             operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         *)local_a8,local_b8);
    std::pair<double,_double>::operator=(pvVar9,&local_c8);
  }
  std::
  vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ::vector((vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
            *)&number_of_levels_in_the_landscape);
  i_3 = 0;
  do {
    bVar5 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
            empty((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
                  local_a8);
    if (((bVar5 ^ 0xffU) & 1) == 0) break;
    if ((bars.
         super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
      for (lambda_n.
           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ppVar4 = lambda_n.
                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
          ppVar8 = (pointer)std::
                            vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                            ::size((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                    *)local_a8), ppVar4 != ppVar8;
          lambda_n.
          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)((long)&(lambda_n.
                                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->first + 1)) {
        poVar10 = std::operator<<((ostream *)&std::clog,"(");
        pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ::operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                               *)local_a8,
                              (size_type)
                              lambda_n.
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,pvVar9->first);
        poVar10 = std::operator<<(poVar10," ");
        pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ::operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                               *)local_a8,
                              (size_type)
                              lambda_n.
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,pvVar9->second);
        std::operator<<(poVar10,")\n");
      }
      std::istream::ignore();
    }
    std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::vector
              ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
               local_118);
    local_134 = std::numeric_limits<int>::max();
    local_134 = -local_134;
    local_138 = 0;
    local_130 = std::make_pair<int,int>(&local_134,&local_138);
    std::pair<double,_double>::pair<int,_int,_true>(&local_128,&local_130);
    std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::push_back
              ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
               local_118,&local_128);
    pPVar14 = (Persistence_representations *)local_a8;
    pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
             operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         *)pPVar14,0);
    local_178 = pvVar9->first;
    dStack_170 = pvVar9->second;
    pVar15.first = pvVar9->first;
    pVar15.second = pvVar9->second;
    local_160 = minus_length(pPVar14,pVar15);
    local_17c = 0;
    pVar16 = std::make_pair<double,int>(&local_160,&local_17c);
    local_158.second = pVar16.second;
    local_158.first = pVar16.first;
    std::pair<double,_double>::pair<double,_int,_true>(&local_148,&local_158);
    std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::push_back
              ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
               local_118,&local_148);
    pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
             operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         *)local_a8,0);
    std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::push_back
              ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
               local_118,pvVar9);
    if ((bars.
         super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
      poVar10 = std::operator<<((ostream *)&std::clog,"1 Adding to lambda_n : (");
      iVar7 = std::numeric_limits<int>::max();
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,-iVar7);
      poVar10 = std::operator<<(poVar10," ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,0);
      poVar10 = std::operator<<(poVar10,") , (");
      pPVar14 = (Persistence_representations *)local_a8;
      pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                           *)pPVar14,0);
      a_05.first = pvVar9->first;
      a_05.second = pvVar9->second;
      dVar1 = minus_length(pPVar14,a_05);
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,dVar1);
      poVar10 = std::operator<<(poVar10," ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,0);
      poVar10 = std::operator<<(poVar10,") , (");
      pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                           *)local_a8,0);
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,pvVar9->first);
      poVar10 = std::operator<<(poVar10," ");
      pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                           *)local_a8,0);
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,pvVar9->second);
      std::operator<<(poVar10,") \n");
    }
    newCharacteristicPoints.
    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x1;
    std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::vector
              ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
               &p_1);
    for (; ppVar4 = newCharacteristicPoints.
                    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
        ppVar8 = (pointer)std::
                          vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ::size((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                  *)local_a8), ppVar4 < ppVar8;
        newCharacteristicPoints.
        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)((long)&(newCharacteristicPoints.
                               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage)->first +
                      local_1d0)) {
      local_1d0 = 1;
      pPVar14 = (Persistence_representations *)local_a8;
      pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                           *)pPVar14,
                          (size_type)
                          newCharacteristicPoints.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      a_06.first = pvVar9->first;
      a_06.second = pvVar9->second;
      dVar1 = minus_length(pPVar14,a_06);
      sVar11 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               size((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     *)local_118);
      pPVar14 = (Persistence_representations *)local_118;
      pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                           *)pPVar14,sVar11 - 1);
      a_07.first = pvVar9->first;
      a_07.second = pvVar9->second;
      dVar2 = minus_length(pPVar14,a_07);
      if (dVar1 < dVar2) {
LAB_00105e60:
        pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ::operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                               *)local_a8,
                              (size_type)
                              newCharacteristicPoints.
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
        push_back((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
                  &p_1,pvVar9);
        if ((bars.
             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
          poVar10 = std::operator<<((ostream *)&std::clog,"7 Adding to newCharacteristicPoints : (")
          ;
          pvVar9 = std::
                   vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                   operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                               *)local_a8,
                              (size_type)
                              newCharacteristicPoints.
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,pvVar9->first);
          poVar10 = std::operator<<(poVar10," ");
          pvVar9 = std::
                   vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                   operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                               *)local_a8,
                              (size_type)
                              newCharacteristicPoints.
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,pvVar9->second);
          std::operator<<(poVar10,")\n");
        }
      }
      else {
        pPVar14 = (Persistence_representations *)local_a8;
        pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ::operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                               *)pPVar14,
                              (size_type)
                              newCharacteristicPoints.
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
        a_08.first = pvVar9->first;
        a_08.second = pvVar9->second;
        dVar1 = birth_plus_deaths(pPVar14,a_08);
        sVar11 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ::size((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         *)local_118);
        pPVar14 = (Persistence_representations *)local_118;
        pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ::operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                               *)pPVar14,sVar11 - 1);
        a_09.first = pvVar9->first;
        a_09.second = pvVar9->second;
        dVar2 = birth_plus_deaths(pPVar14,a_09);
        if (dVar1 <= dVar2) goto LAB_00105e60;
        pPVar14 = (Persistence_representations *)local_a8;
        pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ::operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                               *)pPVar14,
                              (size_type)
                              newCharacteristicPoints.
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
        a_10.first = pvVar9->first;
        a_10.second = pvVar9->second;
        dVar1 = minus_length(pPVar14,a_10);
        sVar11 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ::size((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         *)local_118);
        pPVar14 = (Persistence_representations *)local_118;
        pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ::operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                               *)pPVar14,sVar11 - 1);
        point.second = pvVar9->first;
        a_11.first = pvVar9->first;
        a_11.second = pvVar9->second;
        dVar2 = birth_plus_deaths(pPVar14,a_11);
        if (dVar2 <= dVar1) {
          pPVar14 = (Persistence_representations *)local_118;
          sVar11 = std::
                   vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                   size((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         *)pPVar14);
          pvVar9 = std::
                   vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                   operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                               *)pPVar14,sVar11 - 1);
          local_398 = pvVar9->first;
          dStack_390 = pvVar9->second;
          a_22.first = pvVar9->first;
          a_22.second = pvVar9->second;
          local_380 = birth_plus_deaths(pPVar14,a_22);
          local_39c = 0;
          pVar16 = std::make_pair<double,int>(&local_380,&local_39c);
          local_3a8 = pVar16.second;
          local_3b0 = pVar16.first;
          local_378.first = local_3b0;
          local_378.second = local_3a8;
          std::pair<double,_double>::pair<double,_int,_true>(&local_368,&local_378);
          std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
          push_back((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     *)local_118,&local_368);
          pPVar14 = (Persistence_representations *)local_a8;
          pvVar9 = std::
                   vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                   operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                               *)pPVar14,
                              (size_type)
                              newCharacteristicPoints.
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          local_3e8 = pvVar9->first;
          dStack_3e0 = pvVar9->second;
          a_23.first = pvVar9->first;
          a_23.second = pvVar9->second;
          local_3d8 = minus_length(pPVar14,a_23);
          local_3ec = 0;
          pVar16 = std::make_pair<double,int>(&local_3d8,&local_3ec);
          local_3f8 = pVar16.second;
          local_400 = pVar16.first;
          local_3d0.first = local_400;
          local_3d0.second = local_3f8;
          std::pair<double,_double>::pair<double,_int,_true>(&local_3c0,&local_3d0);
          std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
          push_back((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     *)local_118,&local_3c0);
          if ((bars.
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
            poVar10 = std::operator<<((ostream *)&std::clog,"5 Adding to lambda_n : (");
            pPVar14 = (Persistence_representations *)local_118;
            sVar11 = std::
                     vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     ::size((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                             *)pPVar14);
            pvVar9 = std::
                     vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     ::operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                   *)pPVar14,sVar11 - 1);
            local_418 = pvVar9->first;
            dStack_410 = pvVar9->second;
            a_24.first = pvVar9->first;
            a_24.second = pvVar9->second;
            dVar1 = birth_plus_deaths(pPVar14,a_24);
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,dVar1);
            poVar10 = std::operator<<(poVar10," ");
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,0);
            std::operator<<(poVar10,")\n");
            poVar10 = std::operator<<((ostream *)&std::clog,"5 Adding to lambda_n : (");
            pPVar14 = (Persistence_representations *)local_a8;
            pvVar9 = std::
                     vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     ::operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                   *)pPVar14,
                                  (size_type)
                                  newCharacteristicPoints.
                                  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_428 = pvVar9->first;
            dStack_420 = pvVar9->second;
            a_25.first = pvVar9->first;
            a_25.second = pvVar9->second;
            dVar1 = minus_length(pPVar14,a_25);
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,dVar1);
            poVar10 = std::operator<<(poVar10," ");
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,0);
            std::operator<<(poVar10,")\n");
          }
        }
        else {
          pPVar14 = (Persistence_representations *)local_a8;
          pPVar13 = pPVar14;
          pvVar9 = std::
                   vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                   operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                               *)pPVar14,
                              (size_type)
                              newCharacteristicPoints.
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          local_258 = pvVar9->first;
          dStack_250 = pvVar9->second;
          a_12.first = pvVar9->first;
          a_12.second = pvVar9->second;
          dVar1 = minus_length(pPVar13,a_12);
          pPVar13 = (Persistence_representations *)local_118;
          sVar11 = std::
                   vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                   size((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         *)pPVar13);
          this_01 = pPVar13;
          pvVar9 = std::
                   vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                   operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                               *)pPVar13,sVar11 - 1);
          local_268 = pvVar9->first;
          dStack_260 = pvVar9->second;
          a_13.first = pvVar9->first;
          a_13.second = pvVar9->second;
          dVar2 = birth_plus_deaths(this_01,a_13);
          local_248 = (dVar1 + dVar2) * 0.5;
          sVar11 = std::
                   vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                   size((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         *)pPVar13);
          pvVar9 = std::
                   vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                   operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                               *)pPVar13,sVar11 - 1);
          local_288 = pvVar9->first;
          dStack_280 = pvVar9->second;
          a_14.first = pvVar9->first;
          a_14.second = pvVar9->second;
          dVar1 = birth_plus_deaths(pPVar13,a_14);
          pvVar9 = std::
                   vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                   operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                               *)pPVar14,
                              (size_type)
                              newCharacteristicPoints.
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          local_298 = pvVar9->first;
          dStack_290 = pvVar9->second;
          a_15.first = pvVar9->first;
          a_15.second = pvVar9->second;
          dVar2 = minus_length(pPVar14,a_15);
          local_270 = (dVar1 - dVar2) * 0.5;
          pVar15 = std::make_pair<double,double>(&local_248,&local_270);
          point.first = pVar15.second;
          auStack_240 = (undefined1  [8])pVar15.first;
          std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
          push_back((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     *)local_118,(value_type *)auStack_240);
          if ((bars.
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
            poVar10 = std::operator<<((ostream *)&std::clog,"2 Adding to lambda_n : (");
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,(double)auStack_240);
            poVar10 = std::operator<<(poVar10," ");
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,point.first);
            std::operator<<(poVar10,")\n");
          }
          if ((bars.
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
            poVar10 = std::operator<<((ostream *)&std::clog,"characteristicPoints[i+p] : ");
            pvVar9 = std::
                     vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     ::operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                   *)local_a8,
                                  (size_type)
                                  ((long)&(newCharacteristicPoints.
                                           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                          first + 1));
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,pvVar9->first);
            poVar10 = std::operator<<(poVar10," ");
            pvVar9 = std::
                     vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     ::operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                   *)local_a8,
                                  (size_type)
                                  ((long)&(newCharacteristicPoints.
                                           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                          first + 1));
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,pvVar9->second);
            std::operator<<(poVar10,"\n");
            poVar10 = std::operator<<((ostream *)&std::clog,"point : ");
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,(double)auStack_240);
            poVar10 = std::operator<<(poVar10," ");
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,point.first);
            std::operator<<(poVar10,"\n");
            getchar();
          }
          while( true ) {
            pdVar3 = &(newCharacteristicPoints.
                       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->first;
            pPVar14 = (Persistence_representations *)local_a8;
            sVar11 = std::
                     vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     ::size((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                             *)pPVar14);
            bVar5 = false;
            if ((ulong)((long)pdVar3 + local_1d0) < sVar11) {
              local_2a8 = (double)auStack_240;
              dStack_2a0 = point.first;
              a_04.second = point.first;
              a_04.first = (double)auStack_240;
              dVar1 = minus_length(pPVar14,a_04);
              pPVar14 = (Persistence_representations *)local_a8;
              pvVar9 = std::
                       vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       ::operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                     *)pPVar14,
                                    (long)&(newCharacteristicPoints.
                                            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                           first + local_1d0);
              local_2b8 = pvVar9->first;
              dStack_2b0 = pvVar9->second;
              a_16.first = pvVar9->first;
              a_16.second = pvVar9->second;
              dVar2 = minus_length(pPVar14,a_16);
              bVar6 = almost_equal(dVar1,dVar2);
              bVar5 = false;
              if (bVar6) {
                local_2c8 = (double)auStack_240;
                local_2c0 = point.first;
                a_03.second = point.first;
                a_03.first = (double)auStack_240;
                dVar1 = birth_plus_deaths(pPVar14,a_03);
                pPVar14 = (Persistence_representations *)local_a8;
                pvVar9 = std::
                         vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         ::operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                       *)pPVar14,
                                      (long)&(newCharacteristicPoints.
                                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                             first + local_1d0);
                local_2d8 = pvVar9->first;
                local_2d0 = pvVar9->second;
                a_17.first = pvVar9->first;
                a_17.second = pvVar9->second;
                dVar2 = birth_plus_deaths(pPVar14,a_17);
                bVar5 = dVar1 <= dVar2;
              }
            }
            if (!bVar5) break;
            pvVar9 = std::
                     vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     ::operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                   *)local_a8,
                                  (long)&(newCharacteristicPoints.
                                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage)->first
                                  + local_1d0);
            std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
            push_back((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       *)&p_1,pvVar9);
            if ((bars.
                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
              poVar10 = std::operator<<((ostream *)&std::clog,
                                        "3.5 Adding to newCharacteristicPoints : (");
              pvVar9 = std::
                       vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       ::operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                     *)local_a8,
                                    (long)&(newCharacteristicPoints.
                                            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                           first + local_1d0);
              poVar10 = (ostream *)std::ostream::operator<<(poVar10,pvVar9->first);
              poVar10 = std::operator<<(poVar10," ");
              pvVar9 = std::
                       vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       ::operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                     *)local_a8,
                                    (long)&(newCharacteristicPoints.
                                            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                           first + local_1d0);
              poVar10 = (ostream *)std::ostream::operator<<(poVar10,pvVar9->second);
              std::operator<<(poVar10,")\n");
              getchar();
            }
            local_1d0 = local_1d0 + 1;
          }
          std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
          push_back((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     *)&p_1,(value_type *)auStack_240);
          if ((bars.
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
            poVar10 = std::operator<<((ostream *)&std::clog,
                                      "4 Adding to newCharacteristicPoints : (");
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,(double)auStack_240);
            poVar10 = std::operator<<(poVar10," ");
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,point.first);
            std::operator<<(poVar10,")\n");
          }
          while( true ) {
            pdVar3 = &(newCharacteristicPoints.
                       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->first;
            pPVar14 = (Persistence_representations *)local_a8;
            sVar11 = std::
                     vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     ::size((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                             *)pPVar14);
            bVar5 = false;
            if ((ulong)((long)pdVar3 + local_1d0) < sVar11) {
              local_2e8 = (double)auStack_240;
              local_2e0 = point.first;
              a_02.second = point.first;
              a_02.first = (double)auStack_240;
              dVar1 = minus_length(pPVar14,a_02);
              pPVar14 = (Persistence_representations *)local_a8;
              pvVar9 = std::
                       vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       ::operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                     *)pPVar14,
                                    (long)&(newCharacteristicPoints.
                                            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                           first + local_1d0);
              local_2f8 = pvVar9->first;
              local_2f0 = pvVar9->second;
              a_18.first = pvVar9->first;
              a_18.second = pvVar9->second;
              dVar2 = minus_length(pPVar14,a_18);
              bVar5 = false;
              if (dVar1 <= dVar2) {
                local_308 = (double)auStack_240;
                local_300 = point.first;
                a_01.second = point.first;
                a_01.first = (double)auStack_240;
                dVar1 = birth_plus_deaths(pPVar14,a_01);
                pPVar14 = (Persistence_representations *)local_a8;
                pvVar9 = std::
                         vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         ::operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                       *)pPVar14,
                                      (long)&(newCharacteristicPoints.
                                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                             first + local_1d0);
                local_318 = pvVar9->first;
                local_310 = pvVar9->second;
                a_19.first = pvVar9->first;
                a_19.second = pvVar9->second;
                dVar2 = birth_plus_deaths(pPVar14,a_19);
                bVar5 = dVar2 <= dVar1;
              }
            }
            if (!bVar5) break;
            pvVar9 = std::
                     vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     ::operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                   *)local_a8,
                                  (long)&(newCharacteristicPoints.
                                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage)->first
                                  + local_1d0);
            std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
            push_back((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       *)&p_1,pvVar9);
            if ((bars.
                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
              poVar10 = std::operator<<((ostream *)&std::clog,"characteristicPoints[i+p] : ");
              pvVar9 = std::
                       vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       ::operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                     *)local_a8,
                                    (long)&(newCharacteristicPoints.
                                            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                           first + local_1d0);
              poVar10 = (ostream *)std::ostream::operator<<(poVar10,pvVar9->first);
              poVar10 = std::operator<<(poVar10," ");
              pvVar9 = std::
                       vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       ::operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                     *)local_a8,
                                    (long)&(newCharacteristicPoints.
                                            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                           first + local_1d0);
              poVar10 = (ostream *)std::ostream::operator<<(poVar10,pvVar9->second);
              std::operator<<(poVar10,"\n");
              poVar10 = std::operator<<((ostream *)&std::clog,"point : ");
              poVar10 = (ostream *)std::ostream::operator<<(poVar10,(double)auStack_240);
              poVar10 = std::operator<<(poVar10," ");
              poVar10 = (ostream *)std::ostream::operator<<(poVar10,point.first);
              std::operator<<(poVar10,"\n");
              poVar10 = std::operator<<((ostream *)&std::clog,
                                        "characteristicPoints[i+p] birth and death : ");
              pPVar14 = (Persistence_representations *)local_a8;
              pvVar9 = std::
                       vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       ::operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                     *)pPVar14,
                                    (long)&(newCharacteristicPoints.
                                            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                           first + local_1d0);
              local_328 = pvVar9->first;
              dStack_320 = pvVar9->second;
              a_20.first = pvVar9->first;
              a_20.second = pvVar9->second;
              dVar1 = minus_length(pPVar14,a_20);
              poVar10 = (ostream *)std::ostream::operator<<(poVar10,dVar1);
              poVar10 = std::operator<<(poVar10," , ");
              pPVar14 = (Persistence_representations *)local_a8;
              pvVar9 = std::
                       vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       ::operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                     *)pPVar14,
                                    (long)&(newCharacteristicPoints.
                                            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                           first + local_1d0);
              local_338 = pvVar9->first;
              dStack_330 = pvVar9->second;
              a_21.first = pvVar9->first;
              a_21.second = pvVar9->second;
              dVar1 = birth_plus_deaths(pPVar14,a_21);
              poVar10 = (ostream *)std::ostream::operator<<(poVar10,dVar1);
              std::operator<<(poVar10,"\n");
              pPVar14 = (Persistence_representations *)&std::clog;
              poVar10 = std::operator<<((ostream *)&std::clog,"point birth and death : ");
              local_348 = (double)auStack_240;
              dStack_340 = point.first;
              a_00.second = point.first;
              a_00.first = (double)auStack_240;
              dVar1 = minus_length(pPVar14,a_00);
              poVar10 = (ostream *)std::ostream::operator<<(poVar10,dVar1);
              this_00 = std::operator<<(poVar10," , ");
              local_358 = (double)auStack_240;
              dStack_350 = point.first;
              a.second = point.first;
              a.first = (double)auStack_240;
              dVar1 = birth_plus_deaths((Persistence_representations *)poVar10,a);
              poVar10 = (ostream *)std::ostream::operator<<(this_00,dVar1);
              std::operator<<(poVar10,"\n");
              poVar10 = std::operator<<((ostream *)&std::clog,
                                        "3 Adding to newCharacteristicPoints : (");
              pvVar9 = std::
                       vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       ::operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                     *)local_a8,
                                    (long)&(newCharacteristicPoints.
                                            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                           first + local_1d0);
              poVar10 = (ostream *)std::ostream::operator<<(poVar10,pvVar9->first);
              poVar10 = std::operator<<(poVar10," ");
              pvVar9 = std::
                       vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       ::operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                     *)local_a8,
                                    (long)&(newCharacteristicPoints.
                                            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                           first + local_1d0);
              poVar10 = (ostream *)std::ostream::operator<<(poVar10,pvVar9->second);
              std::operator<<(poVar10,")\n");
              getchar();
            }
            local_1d0 = local_1d0 + 1;
          }
        }
        pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ::operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                               *)local_a8,
                              (size_type)
                              newCharacteristicPoints.
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
        push_back((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
                  local_118,pvVar9);
        if ((bars.
             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
          poVar10 = std::operator<<((ostream *)&std::clog,"6 Adding to lambda_n : (");
          pvVar9 = std::
                   vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                   operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                               *)local_a8,
                              (size_type)
                              newCharacteristicPoints.
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,pvVar9->first);
          poVar10 = std::operator<<(poVar10," ");
          pvVar9 = std::
                   vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                   operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                               *)local_a8,
                              (size_type)
                              newCharacteristicPoints.
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,pvVar9->second);
          std::operator<<(poVar10,")\n");
        }
      }
    }
    pPVar14 = (Persistence_representations *)local_118;
    sVar11 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
             size((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
                  pPVar14);
    pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
             operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         *)pPVar14,sVar11 - 1);
    local_468 = pvVar9->first;
    dStack_460 = pvVar9->second;
    a_26.first = pvVar9->first;
    a_26.second = pvVar9->second;
    local_450 = birth_plus_deaths(pPVar14,a_26);
    local_46c = 0;
    pVar16 = std::make_pair<double,int>(&local_450,&local_46c);
    local_478 = pVar16.second;
    local_480 = pVar16.first;
    local_448.first = local_480;
    local_448.second = local_478;
    std::pair<double,_double>::pair<double,_int,_true>(&local_438,&local_448);
    std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::push_back
              ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
               local_118,&local_438);
    local_49c = std::numeric_limits<int>::max();
    local_4a0 = 0;
    local_498 = std::make_pair<int,int>(&local_49c,&local_4a0);
    std::pair<double,_double>::pair<int,_int,_true>(&local_490,&local_498);
    std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::push_back
              ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
               local_118,&local_490);
    std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::operator=
              ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
               local_a8,(vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         *)&p_1);
    local_4b8._M_current =
         (pair<double,_double> *)
         std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::begin
                   ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     *)local_118);
    local_4c0 = (pair<double,_double> *)
                std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ::end((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       *)local_118);
    local_4b0 = std::
                unique<__gnu_cxx::__normal_iterator<std::pair<double,double>*,std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>>>
                          (local_4b8,
                           (__normal_iterator<std::pair<double,_double>_*,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
                            )local_4c0);
    __gnu_cxx::
    __normal_iterator<std::pair<double,double>const*,std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>>
    ::__normal_iterator<std::pair<double,double>*>
              ((__normal_iterator<std::pair<double,double>const*,std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>>
                *)&local_4a8,&local_4b0);
    local_4d0._M_current =
         (pair<double,_double> *)
         std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::end
                   ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     *)local_118);
    __gnu_cxx::
    __normal_iterator<std::pair<double,double>const*,std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>>
    ::__normal_iterator<std::pair<double,double>*>
              ((__normal_iterator<std::pair<double,double>const*,std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>>
                *)&local_4c8,&local_4d0);
    std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::erase
              ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
               local_118,local_4a8,local_4c8);
    std::
    vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
    ::push_back(&this->land,(value_type *)local_118);
    i_3 = i_3 + 1;
    if (number_of_levels == i_3) {
      local_4dc = 9;
    }
    else {
      local_4dc = 0;
    }
    std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::~vector
              ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
               &p_1);
    std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::~vector
              ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
               local_118);
  } while (local_4dc == 0);
  std::
  vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ::~vector((vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
             *)&number_of_levels_in_the_landscape);
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::~vector
            ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
             local_a8);
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::~vector
            ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
             local_40);
  return;
}

Assistant:

void Persistence_landscape::construct_persistence_landscape_from_barcode(
    const std::vector<std::pair<double, double> >& p, size_t number_of_levels) {
  bool dbg = false;
  if (dbg) {
    std::clog << "Persistence_landscape::Persistence_landscape( const std::vector< std::pair< double , double > >& p )"
              << std::endl;
  }

  // this is a general algorithm to construct persistence landscapes.
  std::vector<std::pair<double, double> > bars;
  bars.insert(bars.begin(), p.begin(), p.end());
  std::sort(bars.begin(), bars.end(), compare_points_sorting);

  if (dbg) {
    std::clog << "Bars : \n";
    for (size_t i = 0; i != bars.size(); ++i) {
      std::clog << bars[i].first << " " << bars[i].second << "\n";
    }
    getchar();
  }

  std::vector<std::pair<double, double> > characteristicPoints(p.size());
  for (size_t i = 0; i != bars.size(); ++i) {
    characteristicPoints[i] =
        std::make_pair((bars[i].first + bars[i].second) / 2.0, (bars[i].second - bars[i].first) / 2.0);
  }
  std::vector<std::vector<std::pair<double, double> > > Persistence_landscape;
  size_t number_of_levels_in_the_landscape = 0;
  while (!characteristicPoints.empty()) {
    if (dbg) {
      for (size_t i = 0; i != characteristicPoints.size(); ++i) {
        std::clog << "(" << characteristicPoints[i].first << " " << characteristicPoints[i].second << ")\n";
      }
      std::cin.ignore();
    }

    std::vector<std::pair<double, double> > lambda_n;
    lambda_n.push_back(std::make_pair(-std::numeric_limits<int>::max(), 0));
    lambda_n.push_back(std::make_pair(minus_length(characteristicPoints[0]), 0));
    lambda_n.push_back(characteristicPoints[0]);

    if (dbg) {
      std::clog << "1 Adding to lambda_n : (" << -std::numeric_limits<int>::max() << " " << 0 << ") , ("
                << minus_length(characteristicPoints[0]) << " " << 0 << ") , (" << characteristicPoints[0].first << " "
                << characteristicPoints[0].second << ") \n";
    }

    size_t i = 1;
    std::vector<std::pair<double, double> > newCharacteristicPoints;
    while (i < characteristicPoints.size()) {
      size_t p = 1;
      if ((minus_length(characteristicPoints[i]) >= minus_length(lambda_n[lambda_n.size() - 1])) &&
          (birth_plus_deaths(characteristicPoints[i]) > birth_plus_deaths(lambda_n[lambda_n.size() - 1]))) {
        if (minus_length(characteristicPoints[i]) < birth_plus_deaths(lambda_n[lambda_n.size() - 1])) {
          std::pair<double, double> point = std::make_pair(
              (minus_length(characteristicPoints[i]) + birth_plus_deaths(lambda_n[lambda_n.size() - 1])) / 2,
              (birth_plus_deaths(lambda_n[lambda_n.size() - 1]) - minus_length(characteristicPoints[i])) / 2);
          lambda_n.push_back(point);
          if (dbg) {
            std::clog << "2 Adding to lambda_n : (" << point.first << " " << point.second << ")\n";
          }

          if (dbg) {
            std::clog << "characteristicPoints[i+p] : " << characteristicPoints[i + p].first << " "
                      << characteristicPoints[i + p].second << "\n";
            std::clog << "point : " << point.first << " " << point.second << "\n";
            getchar();
          }

          while ((i + p < characteristicPoints.size()) &&
                 (almost_equal(minus_length(point), minus_length(characteristicPoints[i + p]))) &&
                 (birth_plus_deaths(point) <= birth_plus_deaths(characteristicPoints[i + p]))) {
            newCharacteristicPoints.push_back(characteristicPoints[i + p]);
            if (dbg) {
              std::clog << "3.5 Adding to newCharacteristicPoints : (" << characteristicPoints[i + p].first << " "
                        << characteristicPoints[i + p].second << ")\n";
              getchar();
            }
            ++p;
          }

          newCharacteristicPoints.push_back(point);
          if (dbg) {
            std::clog << "4 Adding to newCharacteristicPoints : (" << point.first << " " << point.second << ")\n";
          }

          while ((i + p < characteristicPoints.size()) &&
                 (minus_length(point) <= minus_length(characteristicPoints[i + p])) &&
                 (birth_plus_deaths(point) >= birth_plus_deaths(characteristicPoints[i + p]))) {
            newCharacteristicPoints.push_back(characteristicPoints[i + p]);
            if (dbg) {
              std::clog << "characteristicPoints[i+p] : " << characteristicPoints[i + p].first << " "
                        << characteristicPoints[i + p].second << "\n";
              std::clog << "point : " << point.first << " " << point.second << "\n";
              std::clog << "characteristicPoints[i+p] birth and death : " << minus_length(characteristicPoints[i + p])
                        << " , " << birth_plus_deaths(characteristicPoints[i + p]) << "\n";
              std::clog << "point birth and death : " << minus_length(point) << " , " << birth_plus_deaths(point)
                        << "\n";

              std::clog << "3 Adding to newCharacteristicPoints : (" << characteristicPoints[i + p].first << " "
                        << characteristicPoints[i + p].second << ")\n";
              getchar();
            }
            ++p;
          }

        } else {
          lambda_n.push_back(std::make_pair(birth_plus_deaths(lambda_n[lambda_n.size() - 1]), 0));
          lambda_n.push_back(std::make_pair(minus_length(characteristicPoints[i]), 0));
          if (dbg) {
            std::clog << "5 Adding to lambda_n : (" << birth_plus_deaths(lambda_n[lambda_n.size() - 1]) << " " << 0
                      << ")\n";
            std::clog << "5 Adding to lambda_n : (" << minus_length(characteristicPoints[i]) << " " << 0 << ")\n";
          }
        }
        lambda_n.push_back(characteristicPoints[i]);
        if (dbg) {
          std::clog << "6 Adding to lambda_n : (" << characteristicPoints[i].first << " "
                    << characteristicPoints[i].second << ")\n";
        }
      } else {
        newCharacteristicPoints.push_back(characteristicPoints[i]);
        if (dbg) {
          std::clog << "7 Adding to newCharacteristicPoints : (" << characteristicPoints[i].first << " "
                    << characteristicPoints[i].second << ")\n";
        }
      }
      i = i + p;
    }
    lambda_n.push_back(std::make_pair(birth_plus_deaths(lambda_n[lambda_n.size() - 1]), 0));
    lambda_n.push_back(std::make_pair(std::numeric_limits<int>::max(), 0));

    characteristicPoints = newCharacteristicPoints;

    lambda_n.erase(std::unique(lambda_n.begin(), lambda_n.end()), lambda_n.end());
    this->land.push_back(lambda_n);

    ++number_of_levels_in_the_landscape;
    if (number_of_levels == number_of_levels_in_the_landscape) {
      break;
    }
  }
}